

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffuky(fitsfile *fptr,int datatype,char *keyname,void *value,char *comm,int *status)

{
  char *in_RCX;
  char *in_RDX;
  int in_ESI;
  char *in_RDI;
  int *in_R8;
  int *in_R9;
  float value_00;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*in_R9 < 1) {
    if (in_ESI == 0x10) {
      ffukys((fitsfile *)CONCAT44(0x10,in_stack_ffffffffffffffe8),in_RDX,in_RCX,(char *)in_R8,in_R9)
      ;
    }
    else if (in_ESI == 0xb) {
      ffukyj((fitsfile *)CONCAT44(0xb,in_stack_ffffffffffffffe8),in_RDX,(LONGLONG)in_RCX,
             (char *)in_R8,in_R9);
    }
    else if (in_ESI == 0xc) {
      ffukyj((fitsfile *)CONCAT44(0xc,in_stack_ffffffffffffffe8),in_RDX,(LONGLONG)in_RCX,
             (char *)in_R8,in_R9);
    }
    else if (in_ESI == 0x14) {
      ffukyj((fitsfile *)CONCAT44(0x14,in_stack_ffffffffffffffe8),in_RDX,(LONGLONG)in_RCX,
             (char *)in_R8,in_R9);
    }
    else if (in_ESI == 0x15) {
      ffukyj((fitsfile *)CONCAT44(0x15,in_stack_ffffffffffffffe8),in_RDX,(LONGLONG)in_RCX,
             (char *)in_R8,in_R9);
    }
    else if (in_ESI == 0x1f) {
      ffukyj((fitsfile *)CONCAT44(0x1f,in_stack_ffffffffffffffe8),in_RDX,(LONGLONG)in_RCX,
             (char *)in_R8,in_R9);
    }
    else {
      iVar1 = (int)((ulong)in_RDX >> 0x20);
      if (in_ESI == 0x1e) {
        ffukyg((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
               (double)CONCAT44(0x1e,in_stack_ffffffffffffffe8),iVar1,in_RCX,in_R8);
      }
      else {
        value_00 = (float)((ulong)in_RCX >> 0x20);
        if (in_ESI == 0xe) {
          ffukyl((fitsfile *)CONCAT44(0xe,in_stack_ffffffffffffffe8),in_RDX,(int)value_00,
                 (char *)in_R8,in_R9);
        }
        else if (in_ESI == 0x28) {
          ffukyuj((fitsfile *)CONCAT44(0x28,in_stack_ffffffffffffffe8),in_RDX,(ULONGLONG)in_RCX,
                  (char *)in_R8,in_R9);
        }
        else if (in_ESI == 0x50) {
          ffukyuj((fitsfile *)CONCAT44(0x50,in_stack_ffffffffffffffe8),in_RDX,(ULONGLONG)in_RCX,
                  (char *)in_R8,in_R9);
        }
        else if (in_ESI == 0x29) {
          ffukyj((fitsfile *)CONCAT44(0x29,in_stack_ffffffffffffffe8),in_RDX,(LONGLONG)in_RCX,
                 (char *)in_R8,in_R9);
        }
        else if (in_ESI == 0x51) {
          ffukyj((fitsfile *)CONCAT44(0x51,in_stack_ffffffffffffffe8),in_RDX,(LONGLONG)in_RCX,
                 (char *)in_R8,in_R9);
        }
        else if (in_ESI == 0x2a) {
          ffukye((fitsfile *)CONCAT44(0x2a,in_stack_ffffffffffffffe8),in_RDX,value_00,(int)in_RCX,
                 (char *)in_R8,in_R9);
        }
        else if (in_ESI == 0x52) {
          ffukyd((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                 (double)CONCAT44(0x52,in_stack_ffffffffffffffe8),iVar1,in_RCX,in_R8);
        }
        else if (in_ESI == 0x53) {
          ffukyc((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                 (float *)CONCAT44(0x53,in_stack_ffffffffffffffe8),iVar1,in_RCX,in_R8);
        }
        else if (in_ESI == 0xa3) {
          ffukym((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                 (double *)CONCAT44(0xa3,in_stack_ffffffffffffffe8),iVar1,in_RCX,in_R8);
        }
        else {
          *in_R9 = 0x19a;
        }
      }
    }
    iVar1 = *in_R9;
  }
  else {
    iVar1 = *in_R9;
  }
  return iVar1;
}

Assistant:

int ffuky( fitsfile *fptr,     /* I - FITS file pointer        */
           int  datatype,      /* I - datatype of the value    */
           const char *keyname,/* I - name of keyword to write */
           void *value,        /* I - keyword value            */
           const char *comm,   /* I - keyword comment          */
           int  *status)       /* IO - error status            */
/*
  Update the keyword, value and comment in the FITS header.
  The datatype is specified by the 2nd argument.
*/
{
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TSTRING)
    {
        ffukys(fptr, keyname, (char *) value, comm, status);
    }
    else if (datatype == TBYTE)
    {
        ffukyj(fptr, keyname, (LONGLONG) *(unsigned char *) value, comm, status);
    }
    else if (datatype == TSBYTE)
    {
        ffukyj(fptr, keyname, (LONGLONG) *(signed char *) value, comm, status);
    }
    else if (datatype == TUSHORT)
    {
        ffukyj(fptr, keyname, (LONGLONG) *(unsigned short *) value, comm, status);
    }
    else if (datatype == TSHORT)
    {
        ffukyj(fptr, keyname, (LONGLONG) *(short *) value, comm, status);
    }
    else if (datatype == TINT)
    {
        ffukyj(fptr, keyname, (LONGLONG) *(int *) value, comm, status);
    }
    else if (datatype == TUINT)
    {
        ffukyg(fptr, keyname, (double) *(unsigned int *) value, 0,
               comm, status);
    }
    else if (datatype == TLOGICAL)
    {
        ffukyl(fptr, keyname, *(int *) value, comm, status);
    }
    else if (datatype == TULONG)
    {
        ffukyuj(fptr, keyname, (ULONGLONG) *(unsigned long *) value,
               comm, status);
    }
    else if (datatype == TULONGLONG)
    {
        ffukyuj(fptr, keyname, (ULONGLONG) *(ULONGLONG *) value,
               comm, status);
    }
    else if (datatype == TLONG)
    {
        ffukyj(fptr, keyname, (LONGLONG) *(long *) value, comm, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffukyj(fptr, keyname, *(LONGLONG *) value, comm, status);
    }
    else if (datatype == TFLOAT)
    {
        ffukye(fptr, keyname, *(float *) value, -7, comm, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffukyd(fptr, keyname, *(double *) value, -15, comm, status);
    }
    else if (datatype == TCOMPLEX)
    {
        ffukyc(fptr, keyname, (float *) value, -7, comm, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
        ffukym(fptr, keyname, (double *) value, -15, comm, status);
    }
    else
        *status = BAD_DATATYPE;

    return(*status);
}